

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

void __thiscall
tchecker::clock_updates_visitor_t::visit
          (clock_updates_visitor_t *this,typed_int_to_clock_assign_statement_t *stmt)

{
  size_t sVar1;
  typed_lvalue_expression_t *x;
  long *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<const_tchecker::expression_t> local_30;
  
  sVar1 = this->_loop_depth;
  x = (typed_lvalue_expression_t *)typed_int_to_clock_assign_statement_t::clock(stmt);
  if (sVar1 == 0) {
    typed_int_to_clock_assign_statement_t::value_ptr
              ((typed_int_to_clock_assign_statement_t *)&local_40);
    if (local_40 == (long *)0x0) {
      local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_40 + *(long *)(*local_40 + -0x38));
    }
    local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_38._M_pi;
    local_40 = (long *)0x0;
    _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    update_int_to_clock_outside_loop(this,x,&local_30);
  }
  else {
    typed_int_to_clock_assign_statement_t::value_ptr
              ((typed_int_to_clock_assign_statement_t *)&local_40);
    if (local_40 == (long *)0x0) {
      local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_40 + *(long *)(*local_40 + -0x38));
    }
    local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_38._M_pi;
    local_40 = (long *)0x0;
    _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    update_int_to_clock_inside_loop(this,x,&local_30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  return;
}

Assistant:

virtual void visit(tchecker::typed_int_to_clock_assign_statement_t const & stmt)
  {
    if (in_loop())
      update_int_to_clock_inside_loop(stmt.clock(), stmt.value_ptr());
    else
      update_int_to_clock_outside_loop(stmt.clock(), stmt.value_ptr());
  }